

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O1

Status __thiscall
leveldb::TableCache::FindTable
          (TableCache *this,uint64_t file_number,uint64_t file_size,Handle **handle)

{
  _Alloc_hider _Var1;
  long lVar2;
  undefined8 *puVar3;
  long *in_R8;
  char *__tmp;
  RandomAccessFile *file;
  Table *table;
  string old_fname;
  Slice key;
  char buf [8];
  string fname;
  RandomAccessFile *local_b0;
  Table *local_a8;
  Handle **local_a0;
  long *local_98;
  Env *local_90;
  string local_88;
  uint64_t *local_68;
  undefined8 local_60;
  uint64_t local_58;
  string local_50;
  
  this->env_ = (Env *)0x0;
  local_68 = &local_58;
  local_60 = 8;
  local_58 = file_size;
  lVar2 = (**(code **)(**(long **)(file_number + 0x30) + 0x18))();
  *in_R8 = lVar2;
  if (lVar2 == 0) {
    local_a0 = handle;
    local_98 = in_R8;
    TableFileName(&local_50,(string *)(file_number + 8),file_size);
    local_b0 = (RandomAccessFile *)0x0;
    local_a8 = (Table *)0x0;
    (**(code **)(**(long **)file_number + 0x18))(&local_88,*(long **)file_number,&local_50);
    _Var1._M_p = local_88._M_dataplus._M_p;
    this->env_ = (Env *)local_88._M_dataplus._M_p;
    if ((Env *)local_88._M_dataplus._M_p != (Env *)0x0) {
      SSTTableFileName(&local_88,(string *)(file_number + 8),file_size);
      (**(code **)(**(long **)file_number + 0x18))
                (&local_90,*(long **)file_number,&local_88,&local_b0);
      if (local_90 == (Env *)0x0) {
        this->env_ = (Env *)0x0;
        local_90 = (Env *)_Var1._M_p;
      }
      operator_delete__(local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    if (this->env_ == (Env *)0x0) {
      Table::Open((Table *)&local_88,*(Options **)(file_number + 0x28),local_b0,(uint64_t)local_a0,
                  &local_a8);
      this->env_ = (Env *)local_88._M_dataplus._M_p;
    }
    if (this->env_ == (Env *)0x0) {
      puVar3 = (undefined8 *)operator_new(0x10);
      *puVar3 = local_b0;
      puVar3[1] = local_a8;
      lVar2 = (**(code **)(**(long **)(file_number + 0x30) + 0x10))
                        (*(long **)(file_number + 0x30),&local_68,puVar3,1,DeleteEntry);
      *local_98 = lVar2;
    }
    else {
      if (local_a8 != (Table *)0x0) {
        __assert_fail("table == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/table_cache.cc"
                      ,0x40,
                      "Status leveldb::TableCache::FindTable(uint64_t, uint64_t, Cache::Handle **)")
        ;
      }
      if (local_b0 != (RandomAccessFile *)0x0) {
        (*local_b0->_vptr_RandomAccessFile[1])();
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status TableCache::FindTable(uint64_t file_number, uint64_t file_size,
                             Cache::Handle** handle) {
  Status s;
  char buf[sizeof(file_number)];
  EncodeFixed64(buf, file_number);
  Slice key(buf, sizeof(buf));
  *handle = cache_->Lookup(key);
  if (*handle == nullptr) {
    std::string fname = TableFileName(dbname_, file_number);
    RandomAccessFile* file = nullptr;
    Table* table = nullptr;
    s = env_->NewRandomAccessFile(fname, &file);
    if (!s.ok()) {
      std::string old_fname = SSTTableFileName(dbname_, file_number);
      if (env_->NewRandomAccessFile(old_fname, &file).ok()) {
        s = Status::OK();
      }
    }
    if (s.ok()) {
      s = Table::Open(options_, file, file_size, &table);
    }

    if (!s.ok()) {
      assert(table == nullptr);
      delete file;
      // We do not cache error results so that if the error is transient,
      // or somebody repairs the file, we recover automatically.
    } else {
      TableAndFile* tf = new TableAndFile;
      tf->file = file;
      tf->table = table;
      *handle = cache_->Insert(key, tf, 1, &DeleteEntry);
    }
  }
  return s;
}